

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_heter_queue.h
# Opt level: O2

MessageInABottle * __thiscall
density::
sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
::consume_operation::
element<density_tests::SpQueueSamples<(density::concurrency_cardinality)0,(density::concurrency_cardinality)1>::samples(std::ostream&)::MessageInABottle>
          (consume_operation *this)

{
  bool bVar1;
  runtime_type<> *prVar2;
  MessageInABottle *pMVar3;
  
  bVar1 = detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
          ::Consume::empty((Consume *)this);
  if (!bVar1) {
    prVar2 = sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
             ::consume_operation::complete_type((consume_operation *)this);
    if (prVar2->m_feature_table ==
        (tuple_type *)
        detail::
        FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::SpQueueSamples<(density::concurrency_cardinality)0,(density::concurrency_cardinality)1>::samples(std::ostream&)::MessageInABottle>
        ::s_table) goto LAB_00fc558b;
  }
  density_tests::detail::assert_failed<>
            ("!empty() && complete_type().template is<COMPLETE_ELEMENT_TYPE>()",
             "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/sp_heter_queue.h"
             ,0x48a);
LAB_00fc558b:
  pMVar3 = (MessageInABottle *)
           detail::
           LFQueue_Base<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
           ::get_element(*(LfQueueControl **)(this + 8),SUB41((*(uint *)(this + 0x10) & 4) >> 2,0));
  return pMVar3;
}

Assistant:

COMPLETE_ELEMENT_TYPE & element() const noexcept
            {
                DENSITY_ASSERT(!empty() && complete_type().template is<COMPLETE_ELEMENT_TYPE>());
                return *static_cast<COMPLETE_ELEMENT_TYPE *>(
                  Base::get_element(m_consume_data.m_control, m_consume_data.external()));
            }